

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timMan.c
# Opt level: O3

void Tim_ManPrintBoxCopy(Tim_Man_t *p)

{
  uint uVar1;
  uint uVar2;
  Vec_Ptr_t *pVVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  
  if (p != (Tim_Man_t *)0x0) {
    puts("TIMING MANAGER:");
    if ((p->vBoxes == (Vec_Ptr_t *)0x0) || (p->vBoxes->nSize == 0)) {
      uVar1 = p->nCis;
      uVar4 = uVar1;
    }
    else {
      uVar1 = Tim_ManBoxOutputFirst(p,0);
      uVar4 = p->nCis;
    }
    uVar2 = Tim_ManPoNum(p);
    if (p->vBoxes == (Vec_Ptr_t *)0x0) {
      uVar5 = 0;
    }
    else {
      uVar5 = (ulong)(uint)p->vBoxes->nSize;
    }
    printf("PI = %d. CI = %d. PO = %d. CO = %d. Box = %d.\n",(ulong)uVar1,(ulong)uVar4,(ulong)uVar2,
           (ulong)(uint)p->nCos,uVar5);
    pVVar3 = p->vBoxes;
    if ((pVVar3 != (Vec_Ptr_t *)0x0) && (0 < pVVar3->nSize)) {
      lVar6 = 0;
      do {
        printf("%d ",(ulong)*(uint *)((long)pVVar3->pArray[lVar6] + 0x14));
        lVar6 = lVar6 + 1;
        pVVar3 = p->vBoxes;
      } while (lVar6 < pVVar3->nSize);
    }
    putchar(10);
    return;
  }
  return;
}

Assistant:

void Tim_ManPrintBoxCopy( Tim_Man_t * p )
{
    Tim_Box_t * pBox;
    int i;
    if ( p == NULL )
        return;
    printf( "TIMING MANAGER:\n" );
    printf( "PI = %d. CI = %d. PO = %d. CO = %d. Box = %d.\n", 
        Tim_ManPiNum(p), Tim_ManCiNum(p), Tim_ManPoNum(p), Tim_ManCoNum(p), Tim_ManBoxNum(p) );

    if ( Tim_ManBoxNum(p) > 0 )
    Tim_ManForEachBox( p, pBox, i )
        printf( "%d ", pBox->iCopy );
    printf( "\n" );
}